

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O0

offset_in_this_suite_class_to_subr
agge::tests::RoundedRectangleTests::__RewindingIteratorStartsOverWithPoints_meta(char **name)

{
  char **name_local;
  
  *name = "RewindingIteratorStartsOverWithPoints";
  return (offset_in_this_suite_class_to_subr)RewindingIteratorStartsOverWithPoints;
}

Assistant:

test( RewindingIteratorStartsOverWithPoints )
			{
				// INIT
				real_t x, y;
				rounded_rectangle r(10.0f, 20.0f, 30.0f, 35.0f, 5.0f);

				r.vertex(&x, &y);
				r.vertex(&x, &y);
				r.vertex(&x, &y);

				// ACT
				r.rewind(0);

				// ACT / ASSERT
				assert_equal(path_command_move_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
			}